

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall
CVmImageWriter::begin_pool_page
          (CVmImageWriter *this,uint pool_id,uint32_t page_index,int mandatory,uchar xor_mask)

{
  undefined4 in_ECX;
  uint in_EDX;
  uint in_ESI;
  size_t in_RDI;
  undefined1 in_R8B;
  char buf [16];
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined3 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  undefined1 uVar2;
  
  uVar1 = CONCAT13(in_R8B,in_stack_ffffffffffffffe8);
  begin_block((CVmImageWriter *)CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,uVar1),
              in_stack_ffffffffffffffe4);
  uVar2 = (undefined1)((uint)uVar1 >> 0x18);
  ::oswp2(&stack0xffffffffffffffd8,in_ESI);
  ::oswp4(&stack0xffffffffffffffda,(ulong)in_EDX);
  CVmFile::write_bytes
            ((CVmFile *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)CONCAT17(in_stack_ffffffffffffffdf,CONCAT16(uVar2,in_stack_ffffffffffffffd8)),
             in_RDI);
  return;
}

Assistant:

void CVmImageWriter::begin_pool_page(uint pool_id, uint32_t page_index,
                                     int mandatory, uchar xor_mask)
{
    char buf[16];

    /* begin the block */
    begin_block("CPPG", mandatory);

    /* prepare the prefix */
    oswp2(buf, pool_id);
    oswp4(buf+2, page_index);
    buf[6] = xor_mask;

    /* write the prefix */
    fp_->write_bytes(buf, 7);
}